

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  char cVar1;
  undefined1 n [16];
  undefined1 value [16];
  detail dVar2;
  uint uVar3;
  uint uVar4;
  buffer_appender<char> bVar5;
  int iVar6;
  detail *pdVar7;
  detail *pdVar8;
  void *pvVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong count;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  locale_ref in_stack_fffffffffffffd68;
  locale_ref in_stack_fffffffffffffd70;
  detail adStack_279 [41];
  anon_class_16_2_3f014a30 local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_240;
  
  grouping_impl<char>(in_stack_fffffffffffffd70);
  if (in_stack_fffffffffffffd70.locale_ == (void *)0x0) {
    on_dec(this);
  }
  else {
    dVar2 = (detail)thousands_sep_impl<char>(in_stack_fffffffffffffd68);
    if (dVar2 == (detail)0x0) {
      on_dec(this);
    }
    else {
      n._8_8_ = in_stack_fffffffffffffd70.locale_;
      n._0_8_ = in_stack_fffffffffffffd68.locale_;
      uVar3 = count_digits(*(detail **)&this->abs_value,(uint128_t)n);
      uVar13 = (ulong)uVar3;
      iVar6 = (int)in_stack_fffffffffffffd70.locale_ + uVar3;
      uVar4 = uVar3;
      for (pvVar9 = (void *)0x0; in_stack_fffffffffffffd70.locale_ != pvVar9;
          pvVar9 = (void *)((long)pvVar9 + 1)) {
        cVar1 = *(char *)((long)in_stack_fffffffffffffd68.locale_ + (long)pvVar9);
        uVar11 = uVar4 - (int)cVar1;
        if ((uVar11 == 0 || (int)uVar4 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          iVar6 = uVar3 + (int)pvVar9;
          if (in_stack_fffffffffffffd70.locale_ != pvVar9) goto LAB_0018cd0d;
          break;
        }
        uVar4 = uVar11;
      }
      iVar6 = (int)(uVar4 - 1) /
              (int)((char *)((long)in_stack_fffffffffffffd68.locale_ + -1))
                   [(long)in_stack_fffffffffffffd70.locale_] + iVar6;
LAB_0018cd0d:
      value._8_8_ = in_stack_fffffffffffffd70.locale_;
      value._0_8_ = in_stack_fffffffffffffd68.locale_;
      format_decimal<char,unsigned__int128>
                (adStack_279 + 1,*(char **)&this->abs_value,(unsigned___int128)value,
                 (int)*(undefined8 *)((long)&this->abs_value + 8));
      local_240.super_buffer<char>.ptr_ = local_240.store_;
      local_240.super_buffer<char>.size_ = 0;
      local_240.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00321df0;
      local_240.super_buffer<char>.capacity_ = 500;
      uVar12 = (long)iVar6 + (long)(int)this->prefix_size;
      count = uVar12 & 0xffffffff;
      buffer<char>::try_resize(&local_240.super_buffer<char>,count);
      iVar6 = 0;
      pdVar8 = (detail *)(local_240.super_buffer<char>.ptr_ + (uVar12 - 1));
      pcVar10 = (char *)in_stack_fffffffffffffd68.locale_;
      while (pdVar7 = pdVar8, 1 < (int)uVar13) {
        pdVar8 = adStack_279 + uVar13;
        uVar13 = uVar13 - 1;
        *pdVar7 = *pdVar8;
        pdVar8 = pdVar7 + -1;
        cVar1 = *pcVar10;
        if ('\0' < cVar1) {
          iVar6 = iVar6 + 1;
          if ((cVar1 != '\x7f') && (iVar6 % (int)cVar1 == 0)) {
            if (pcVar10 + 1 !=
                (char *)((long)in_stack_fffffffffffffd68.locale_ +
                        (long)in_stack_fffffffffffffd70.locale_)) {
              iVar6 = 0;
              pcVar10 = pcVar10 + 1;
            }
            *pdVar8 = dVar2;
            pdVar8 = pdVar7 + -2;
          }
        }
      }
      *pdVar7 = adStack_279[1];
      if (this->prefix_size != 0) {
        pdVar7[-1] = (detail)0x2d;
      }
      local_250.data = local_240.super_buffer<char>.ptr_;
      local_250.size = (int)uVar12;
      bVar5 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                        ((buffer_appender<char>)
                         (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container,this->specs,count,count,&local_250);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_240);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }